

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall t_rs_generator::render_attributes_and_includes(t_rs_generator *this)

{
  bool bVar1;
  ostream *poVar2;
  t_program *ptVar3;
  vector<t_program_*,_std::allocator<t_program_*>_> *__x;
  reference pptVar4;
  string *__x_00;
  vector<t_service_*,_std::allocator<t_service_*>_> *__x_01;
  reference pptVar5;
  reference ppVar6;
  ulong uVar7;
  ofstream_with_content_based_conditional_update *poVar8;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  undefined1 local_1a0 [8];
  string module_namespace;
  string module_name;
  _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  iterator module_iter;
  __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
  local_138;
  const_iterator service_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  allocator local_101;
  string local_100;
  string local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
  local_80;
  t_program **local_78;
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
  local_70;
  const_iterator includes_iter;
  undefined1 local_58 [8];
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  referenced_modules;
  t_rs_generator *this_local;
  
  poVar8 = &this->f_gen_;
  poVar2 = std::operator<<((ostream *)poVar8,"#![allow(unused_imports)]");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"#![allow(unused_extern_crates)]");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,
                           "#![allow(clippy::too_many_arguments, clippy::type_complexity, clippy::vec_box)]"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"#![cfg_attr(rustfmt, rustfmt_skip)]");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar8,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::cell::RefCell;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::collections::{BTreeMap, BTreeSet};");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::convert::{From, TryFrom};");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::default::Default;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::error::Error;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::fmt;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::fmt::{Display, Formatter};");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use std::rc::Rc;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar8,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use thrift::OrderedFloat;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,
                           "use thrift::{ApplicationError, ApplicationErrorKind, ProtocolError, ProtocolErrorKind, TThriftClient};"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,
                           "use thrift::protocol::{TFieldIdentifier, TListIdentifier, TMapIdentifier, TMessageIdentifier, TMessageType, TInputProtocol, TOutputProtocol, TSetIdentifier, TStructIdentifier, TType};"
                          );
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use thrift::protocol::field_id;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use thrift::protocol::verify_expected_message_type;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,
                           "use thrift::protocol::verify_expected_sequence_number;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use thrift::protocol::verify_expected_service_call;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use thrift::protocol::verify_required_field_exists;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)poVar8,"use thrift::server::TProcessor;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar8,(string *)&::endl_abi_cxx11_);
  std::
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  ptVar3 = t_generator::get_program(&this->super_t_generator);
  __x = t_program::get_includes(ptVar3);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)local_58,__x);
  __gnu_cxx::
  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
  __normal_iterator(&local_70);
  local_78 = (t_program **)
             std::vector<t_program_*,_std::allocator<t_program_*>_>::begin
                       ((vector<t_program_*,_std::allocator<t_program_*>_> *)local_58);
  local_70._M_current = local_78;
  while( true ) {
    local_80._M_current =
         (t_program **)
         std::vector<t_program_*,_std::allocator<t_program_*>_>::end
                   ((vector<t_program_*,_std::allocator<t_program_*>_> *)local_58);
    bVar1 = __gnu_cxx::operator!=(&local_70,&local_80);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&local_70);
    __x_00 = t_program::get_name_abi_cxx11_(*pptVar4);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&local_70);
    ptVar3 = *pptVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"rs",&local_101);
    t_program::get_namespace(&local_e0,ptVar3,&local_100);
    std::make_pair<std::__cxx11::string_const&,std::__cxx11::string>(&local_c0,__x_00,&local_e0);
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,&local_c0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    __gnu_cxx::
    __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&local_70);
  }
  ptVar3 = t_generator::get_program(&this->super_t_generator);
  __x_01 = t_program::get_services(ptVar3);
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&service_iter,__x_01);
  __gnu_cxx::
  __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
  __normal_iterator(&local_138);
  local_138._M_current =
       (t_service **)
       std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                 ((vector<t_service_*,_std::allocator<t_service_*>_> *)&service_iter);
  while( true ) {
    module_iter._M_node =
         (_Base_ptr)
         std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                   ((vector<t_service_*,_std::allocator<t_service_*>_> *)&service_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_138,
                       (__normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
                        *)&module_iter);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
              ::operator*(&local_138);
    compute_service_referenced_modules
              (this,*pptVar5,
               (set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<t_service_*const_*,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    operator++(&local_138);
  }
  bVar1 = std::
          set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_150);
    local_150._M_node =
         (_Base_ptr)
         std::
         set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      module_name.field_2._8_8_ =
           std::
           set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::operator!=(&local_150,(_Self *)((long)&module_name.field_2 + 8));
      if (!bVar1) break;
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&local_150);
      std::__cxx11::string::string
                ((string *)(module_namespace.field_2._M_local_buf + 8),(string *)ppVar6);
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&local_150);
      std::__cxx11::string::string((string *)local_1a0,(string *)&ppVar6->second);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,".",&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1e8,"::",&local_1e9);
      string_replace(this,(string *)local_1a0,&local_1c0,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        poVar2 = std::operator<<((ostream *)&this->f_gen_,"use crate::");
        poVar2 = std::operator<<(poVar2,(string *)local_1a0);
        poVar2 = std::operator<<(poVar2,"::");
        rust_snake_case(&local_230,this,(string *)((long)&module_namespace.field_2 + 8));
        poVar2 = std::operator<<(poVar2,(string *)&local_230);
        poVar2 = std::operator<<(poVar2,";");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_230);
      }
      else {
        poVar2 = std::operator<<((ostream *)&this->f_gen_,"use crate::");
        rust_snake_case(&local_210,this,(string *)((long)&module_namespace.field_2 + 8));
        poVar2 = std::operator<<(poVar2,(string *)&local_210);
        poVar2 = std::operator<<(poVar2,";");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_210);
      }
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)(module_namespace.field_2._M_local_buf + 8));
      std::
      _Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_150);
    }
    std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  }
  std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&service_iter);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::~vector
            ((vector<t_program_*,_std::allocator<t_program_*>_> *)local_58);
  std::
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void t_rs_generator::render_attributes_and_includes() {
  // turn off some compiler/clippy warnings

  // code always includes BTreeMap/BTreeSet/OrderedFloat
  f_gen_ << "#![allow(unused_imports)]" << endl;
  // code might not include imports from crates
  f_gen_ << "#![allow(unused_extern_crates)]" << endl;
  // constructors take *all* struct parameters, which can trigger the "too many arguments" warning
  // some auto-gen'd types can be deeply nested. clippy recommends factoring them out which is hard to autogen
  // FIXME: re-enable the 'vec_box' lint see: [THRIFT-5364](https://issues.apache.org/jira/browse/THRIFT-5364)
  // This can happen because we automatically generate a Vec<Box<Type>> when the type is a typedef
  // and it's a forward typedef. This (typedef + forward typedef) can happen in two situations:
  // 1. When the type is recursive
  // 2. When you define types out of order
  f_gen_ << "#![allow(clippy::too_many_arguments, clippy::type_complexity, clippy::vec_box)]" << endl;
  // prevent rustfmt from running against this file
  // lines are too long, code is (thankfully!) not visual-indented, etc.
  // can't use #[rustfmt::skip] see: https://github.com/rust-lang/rust/issues/54726
  f_gen_ << "#![cfg_attr(rustfmt, rustfmt_skip)]" << endl;
  f_gen_ << endl;

  // add standard includes
  f_gen_ << "use std::cell::RefCell;" << endl;
  f_gen_ << "use std::collections::{BTreeMap, BTreeSet};" << endl;
  f_gen_ << "use std::convert::{From, TryFrom};" << endl;
  f_gen_ << "use std::default::Default;" << endl;
  f_gen_ << "use std::error::Error;" << endl;
  f_gen_ << "use std::fmt;" << endl;
  f_gen_ << "use std::fmt::{Display, Formatter};" << endl;
  f_gen_ << "use std::rc::Rc;" << endl;
  f_gen_ << endl;
  f_gen_ << "use thrift::OrderedFloat;" << endl;
  f_gen_ << "use thrift::{ApplicationError, ApplicationErrorKind, ProtocolError, ProtocolErrorKind, TThriftClient};" << endl;
  f_gen_ << "use thrift::protocol::{TFieldIdentifier, TListIdentifier, TMapIdentifier, TMessageIdentifier, TMessageType, TInputProtocol, TOutputProtocol, TSetIdentifier, TStructIdentifier, TType};" << endl;
  f_gen_ << "use thrift::protocol::field_id;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_message_type;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_sequence_number;" << endl;
  f_gen_ << "use thrift::protocol::verify_expected_service_call;" << endl;
  f_gen_ << "use thrift::protocol::verify_required_field_exists;" << endl;
  f_gen_ << "use thrift::server::TProcessor;" << endl;
  f_gen_ << endl;

  // add all the program includes
  // NOTE: this is more involved than you would expect because of service extension
  // Basically, I have to find the closure of all the services and include their modules at the top-level

  set<pair<string, string>> referenced_modules; // set<module, namespace>

  // first, start by adding explicit thrift includes
  const vector<t_program*> includes = get_program()->get_includes();
  vector<t_program*>::const_iterator includes_iter;
  for(includes_iter = includes.begin(); includes_iter != includes.end(); ++includes_iter) {
    referenced_modules.insert(std::make_pair((*includes_iter)->get_name(), (*includes_iter)->get_namespace("rs")));
  }

  // next, recursively iterate through all the services and add the names of any programs they reference
  const vector<t_service*> services = get_program()->get_services();
  vector<t_service*>::const_iterator service_iter;
  for (service_iter = services.begin(); service_iter != services.end(); ++service_iter) {
    compute_service_referenced_modules(*service_iter, referenced_modules);
  }

  // finally, write all the "pub use..." declarations
  if (!referenced_modules.empty()) {
    set<pair<string, string>>::iterator module_iter;
    for (module_iter = referenced_modules.begin(); module_iter != referenced_modules.end(); ++module_iter) {
      string module_name((*module_iter).first);

      string module_namespace((*module_iter).second);
      string_replace(module_namespace, ".", "::");

      if (module_namespace.empty()) {
        f_gen_ << "use crate::" << rust_snake_case(module_name) << ";" << endl;
      } else {
        f_gen_ << "use crate::" << module_namespace << "::" << rust_snake_case(module_name) << ";" << endl;
      }
    }
    f_gen_ << endl;
  }
}